

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# predicates.cxx
# Opt level: O0

double incircle(double *pa,double *pb,double *pc,double *pd)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double errbound;
  double permanent;
  double det;
  double clift;
  double blift;
  double alift;
  double bdxady;
  double adxbdy;
  double adxcdy;
  double cdxady;
  double cdxbdy;
  double bdxcdy;
  double cdy;
  double bdy;
  double ady;
  double cdx;
  double bdx;
  double adx;
  double *pd_local;
  double *pc_local;
  double *pb_local;
  double *pa_local;
  
  dVar1 = *pa - *pd;
  dVar2 = *pb - *pd;
  dVar3 = *pc - *pd;
  dVar4 = pa[1] - pd[1];
  dVar5 = pb[1] - pd[1];
  dVar6 = pc[1] - pd[1];
  dVar7 = dVar1 * dVar1 + dVar4 * dVar4;
  dVar8 = dVar2 * dVar2 + dVar5 * dVar5;
  dVar9 = dVar3 * dVar3 + dVar6 * dVar6;
  pa_local = (double *)
             (dVar9 * (dVar1 * dVar5 - dVar2 * dVar4) +
             dVar7 * (dVar2 * dVar6 - dVar3 * dVar5) + dVar8 * (dVar3 * dVar4 - dVar1 * dVar6));
  dVar1 = (ABS(dVar1 * dVar5) + ABS(dVar2 * dVar4)) * dVar9 +
          (ABS(dVar2 * dVar6) + ABS(dVar3 * dVar5)) * dVar7 +
          (ABS(dVar3 * dVar4) + ABS(dVar1 * dVar6)) * dVar8;
  dVar2 = iccerrboundA * dVar1;
  if (((double)pa_local <= dVar2) && (-(double)pa_local <= dVar2)) {
    pa_local = (double *)incircleadapt(pa,pb,pc,pd,dVar1);
  }
  return (double)pa_local;
}

Assistant:

REAL incircle(REAL *pa, REAL *pb, REAL *pc, REAL *pd)
{
  REAL adx, bdx, cdx, ady, bdy, cdy;
  REAL bdxcdy, cdxbdy, cdxady, adxcdy, adxbdy, bdxady;
  REAL alift, blift, clift;
  REAL det;
  REAL permanent, errbound;

  adx = pa[0] - pd[0];
  bdx = pb[0] - pd[0];
  cdx = pc[0] - pd[0];
  ady = pa[1] - pd[1];
  bdy = pb[1] - pd[1];
  cdy = pc[1] - pd[1];

  bdxcdy = bdx * cdy;
  cdxbdy = cdx * bdy;
  alift = adx * adx + ady * ady;

  cdxady = cdx * ady;
  adxcdy = adx * cdy;
  blift = bdx * bdx + bdy * bdy;

  adxbdy = adx * bdy;
  bdxady = bdx * ady;
  clift = cdx * cdx + cdy * cdy;

  det = alift * (bdxcdy - cdxbdy)
      + blift * (cdxady - adxcdy)
      + clift * (adxbdy - bdxady);

  permanent = (Absolute(bdxcdy) + Absolute(cdxbdy)) * alift
            + (Absolute(cdxady) + Absolute(adxcdy)) * blift
            + (Absolute(adxbdy) + Absolute(bdxady)) * clift;
  errbound = iccerrboundA * permanent;
  if ((det > errbound) || (-det > errbound)) {
    return det;
  }

  return incircleadapt(pa, pb, pc, pd, permanent);
}